

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  vbool<4> vVar11;
  char cVar12;
  undefined4 in_EAX;
  uint uVar13;
  size_t mask;
  ulong uVar14;
  undefined4 uVar15;
  int iVar16;
  Intersectors *pIVar17;
  Intersectors *pIVar18;
  Intersectors *extraout_RDX;
  size_t sVar19;
  NodeRef root;
  Intersectors *pIVar20;
  Intersectors *pIVar21;
  NodeRef *pNVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  ulong uVar24;
  bool bVar25;
  int iVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar45;
  float fVar47;
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar46;
  float fVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar50;
  float fVar56;
  float fVar57;
  vint4 bi_3;
  undefined1 auVar51 [16];
  float fVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar54;
  undefined1 auVar55 [16];
  float fVar59;
  float fVar60;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  vint4 ai_12;
  float fVar67;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar61;
  undefined1 auVar62 [16];
  float fVar68;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  vint4 ai_1;
  float fVar75;
  undefined1 auVar70 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  vint4 ai_3;
  float fVar81;
  float fVar82;
  vint4 bi;
  undefined1 auVar80 [16];
  float fVar83;
  float fVar84;
  float fVar86;
  float fVar87;
  vint4 bi_1;
  undefined1 auVar85 [16];
  uint uVar88;
  uint uVar89;
  uint uVar90;
  vint4 ai_2;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  float fVar94;
  uint uVar95;
  vint4 bi_4;
  float fVar96;
  uint uVar97;
  uint uVar98;
  float fVar99;
  uint uVar102;
  float fVar103;
  uint uVar104;
  float fVar105;
  vfloat4 a0;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  vint4 ai_15;
  float fVar113;
  float fVar114;
  float fVar115;
  uint uVar116;
  float fVar119;
  uint uVar120;
  float fVar121;
  uint uVar122;
  vint4 bi_10;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar123;
  vint4 ai_13;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar128;
  float fVar129;
  float fVar130;
  TravRayK<4,_true> *tray_00;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  undefined8 local_1808;
  undefined8 uStack_1800;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar55 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar80 = *(undefined1 (*) [16])(ray + 0x80);
    auVar70._0_12_ = ZEXT812(0);
    auVar70._12_4_ = 0;
    auVar51._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar80._0_4_);
    auVar51._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar80._4_4_);
    auVar51._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar80._8_4_);
    auVar51._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar80._12_4_);
    uVar13 = movmskps(in_EAX,auVar51);
    if (uVar13 != 0) {
      uVar14 = (ulong)(uVar13 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar68 = tray.dir.field_0._0_4_;
      fVar71 = tray.dir.field_0._4_4_;
      fVar73 = tray.dir.field_0._8_4_;
      fVar75 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar59 = tray.dir.field_0._16_4_;
      fVar63 = tray.dir.field_0._20_4_;
      fVar65 = tray.dir.field_0._24_4_;
      fVar67 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar50 = tray.dir.field_0._32_4_;
      fVar56 = tray.dir.field_0._36_4_;
      fVar57 = tray.dir.field_0._40_4_;
      fVar58 = tray.dir.field_0._44_4_;
      auVar85._0_4_ = fVar59 * fVar59 + fVar50 * fVar50;
      auVar85._4_4_ = fVar63 * fVar63 + fVar56 * fVar56;
      auVar85._8_4_ = fVar65 * fVar65 + fVar57 * fVar57;
      auVar85._12_4_ = fVar67 * fVar67 + fVar58 * fVar58;
      auVar100._0_4_ = fVar68 * fVar68 + auVar85._0_4_;
      auVar100._4_4_ = fVar71 * fVar71 + auVar85._4_4_;
      auVar100._8_4_ = fVar73 * fVar73 + auVar85._8_4_;
      auVar100._12_4_ = fVar75 * fVar75 + auVar85._12_4_;
      auVar85 = rsqrtps(auVar85,auVar100);
      fVar83 = auVar85._0_4_;
      fVar27 = auVar85._4_4_;
      fVar28 = auVar85._8_4_;
      fVar45 = auVar85._12_4_;
      pre.depth_scale.field_0.v[0] = fVar83 * fVar83 * auVar100._0_4_ * -0.5 * fVar83 + fVar83 * 1.5
      ;
      pre.depth_scale.field_0.v[1] = fVar27 * fVar27 * auVar100._4_4_ * -0.5 * fVar27 + fVar27 * 1.5
      ;
      pre.depth_scale.field_0.v[2] = fVar28 * fVar28 * auVar100._8_4_ * -0.5 * fVar28 + fVar28 * 1.5
      ;
      pre.depth_scale.field_0.v[3] =
           fVar45 * fVar45 * auVar100._12_4_ * -0.5 * fVar45 + fVar45 * 1.5;
      do {
        lVar4 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar100 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                            *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar100 = insertps(auVar100,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar83 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar101._0_4_ = auVar100._0_4_ * fVar83;
        auVar101._4_4_ = auVar100._4_4_ * fVar83;
        auVar101._8_4_ = auVar100._8_4_ * fVar83;
        auVar101._12_4_ = auVar100._12_4_ * fVar83;
        uVar24 = CONCAT44(auVar101._4_4_,auVar101._4_4_);
        auVar30._0_8_ = uVar24 ^ 0x8000000080000000;
        auVar30._8_4_ = -auVar101._12_4_;
        auVar30._12_4_ = -auVar101._12_4_;
        auVar100 = blendps(auVar30,auVar70,0xe);
        auVar126._4_4_ = auVar100._0_4_;
        auVar126._0_4_ = auVar101._8_4_;
        auVar126._8_4_ = auVar100._4_4_;
        auVar126._12_4_ = 0;
        auVar125._4_4_ = auVar100._0_4_;
        auVar125._0_4_ = auVar101._8_4_;
        auVar125._8_4_ = auVar100._4_4_;
        auVar125._12_4_ = 0;
        auVar125 = dpps(auVar125 << 0x20,auVar126 << 0x20,0x7f);
        uVar24 = CONCAT44(auVar101._12_4_,auVar101._8_4_);
        auVar117._0_8_ = uVar24 ^ 0x8000000080000000;
        auVar117._8_4_ = -auVar101._8_4_;
        auVar117._12_4_ = -auVar101._12_4_;
        auVar85 = insertps(auVar117,auVar101,0x2a);
        auVar100 = dpps(auVar85,auVar85,0x7f);
        iVar26 = -(uint)(auVar100._0_4_ < auVar125._0_4_);
        auVar31._4_4_ = iVar26;
        auVar31._0_4_ = iVar26;
        auVar31._8_4_ = iVar26;
        auVar31._12_4_ = iVar26;
        auVar100 = blendvps(auVar85,auVar126 << 0x20,auVar31);
        auVar85 = dpps(auVar100,auVar100,0x7f);
        auVar126 = rsqrtss(auVar85,auVar85);
        fVar27 = auVar126._0_4_;
        fVar27 = fVar27 * 1.5 - fVar27 * fVar27 * auVar85._0_4_ * 0.5 * fVar27;
        fVar28 = fVar27 * auVar100._0_4_;
        fVar45 = fVar27 * auVar100._4_4_;
        fVar47 = fVar27 * auVar100._8_4_;
        fVar27 = fVar27 * auVar100._12_4_;
        fVar115 = fVar45 * auVar101._0_4_ - auVar101._4_4_ * fVar28;
        fVar119 = fVar47 * auVar101._4_4_ - auVar101._8_4_ * fVar45;
        fVar121 = fVar28 * auVar101._8_4_ - auVar101._0_4_ * fVar47;
        auVar118._12_4_ = fVar27 * auVar101._12_4_ - auVar101._12_4_ * fVar27;
        auVar118._0_8_ = CONCAT44(fVar121,fVar119);
        auVar118._8_4_ = fVar115;
        auVar124._8_4_ = fVar115;
        auVar124._0_8_ = auVar118._0_8_;
        auVar124._12_4_ = auVar118._12_4_;
        auVar100 = dpps(auVar124,auVar118,0x7f);
        pIVar20 = (Intersectors *)(uVar14 - 1);
        pIVar17 = (Intersectors *)(lVar4 * 0x30);
        auVar85 = rsqrtss(auVar100,auVar100);
        fVar27 = auVar85._0_4_;
        fVar27 = fVar27 * 1.5 - fVar27 * fVar27 * auVar100._0_4_ * 0.5 * fVar27;
        aVar32.m128[1] = fVar27 * fVar115;
        aVar32.m128[0] = fVar47;
        aVar32.m128[2] = auVar101._8_4_ * fVar83;
        aVar32.m128[3] = 0.0;
        pre.ray_space[lVar4].vx.field_0.m128[0] = fVar28;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar27 * fVar119;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar101._0_4_ * fVar83;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar9.m128[1] = fVar27 * fVar121;
        aVar9.m128[0] = fVar45;
        aVar9.m128[2] = auVar101._4_4_ * fVar83;
        aVar9.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar9;
        pre.ray_space[lVar4].vz.field_0 = aVar32;
        uVar14 = uVar14 & (ulong)pIVar20;
      } while (uVar14 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar33._4_4_ = -(uint)(ABS(fVar71) < 1e-18);
      auVar33._0_4_ = -(uint)(ABS(fVar68) < 1e-18);
      auVar33._8_4_ = -(uint)(ABS(fVar73) < 1e-18);
      auVar33._12_4_ = -(uint)(ABS(fVar75) < 1e-18);
      auVar85 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar100 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar34._4_4_ = -(uint)(ABS(fVar63) < 1e-18);
      auVar34._0_4_ = -(uint)(ABS(fVar59) < 1e-18);
      auVar70 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar35._4_4_ = -(uint)(ABS(fVar56) < 1e-18);
      auVar35._0_4_ = -(uint)(ABS(fVar50) < 1e-18);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar85,_DAT_0201c930,auVar33);
      auVar34._8_4_ = -(uint)(ABS(fVar65) < 1e-18);
      auVar34._12_4_ = -(uint)(ABS(fVar67) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar100,_DAT_0201c930,auVar34)
      ;
      auVar35._8_4_ = -(uint)(ABS(fVar57) < 1e-18);
      auVar35._12_4_ = -(uint)(ABS(fVar58) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar70,_DAT_0201c930,auVar35);
      tray.nearXYZ.field_0._0_4_ = -(uint)(tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)(tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar36._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar36._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar36._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar36._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar36);
      auVar37._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar37._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar37._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar37._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar37);
      auVar70 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar80 = maxps(auVar80,ZEXT816(0));
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar70,auVar51);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar80,auVar51);
      auVar80._8_4_ = 0xffffffff;
      auVar80._0_8_ = 0xffffffffffffffff;
      auVar80._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar80 ^ auVar51);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pIVar21 = (Intersectors *)0x3;
      }
      else {
        pIVar21 = (Intersectors *)
                  ((ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2);
      }
      pNVar22 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar23 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar26 = 0x224ff80;
      aVar128 = _DAT_01feb9f0;
      do {
        paVar23 = paVar23 + -1;
        root.ptr = pNVar22[-1].ptr;
        pNVar22 = pNVar22 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_002527be:
          iVar26 = 3;
        }
        else {
          aVar54.v = *(__m128 *)paVar23->v;
          auVar38._4_4_ = -(uint)(aVar54.v[1] < tray.tfar.field_0.v[1]);
          auVar38._0_4_ = -(uint)(aVar54.v[0] < tray.tfar.field_0.v[0]);
          auVar38._8_4_ = -(uint)(aVar54.v[2] < tray.tfar.field_0.v[2]);
          auVar38._12_4_ = -(uint)(aVar54.v[3] < tray.tfar.field_0.v[3]);
          uVar13 = movmskps(iVar26,auVar38);
          if (uVar13 == 0) {
            iVar26 = 2;
          }
          else {
            uVar14 = (ulong)(uVar13 & 0xff);
            pIVar18 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar13 & 0xff);
            iVar26 = 0;
            if (pIVar18 <= pIVar21) {
              do {
                sVar19 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> sVar19 & 1) == 0; sVar19 = sVar19 + 1) {
                  }
                }
                tray_00 = &tray;
                pIVar20 = This;
                pIVar17 = (Intersectors *)context;
                bVar25 = occluded1(This,bvh,root,sVar19,&pre,ray,tray_00,context);
                if (bVar25) {
                  terminated.field_0.i[sVar19] = -1;
                }
                uVar14 = uVar14 & uVar14 - 1;
              } while (uVar14 != 0);
              iVar16 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar26 = 3;
              aVar128 = _DAT_01feb9f0;
              if (iVar16 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar26 = 2;
              }
            }
            vVar11.field_0 = terminated.field_0;
            if (pIVar21 < pIVar18) {
              do {
                fVar50 = aVar54.v[0];
                fVar56 = aVar54.v[1];
                fVar57 = aVar54.v[2];
                fVar58 = aVar54.v[3];
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_002527be;
                  auVar44._4_4_ = -(uint)(fVar56 < tray.tfar.field_0.v[1]);
                  auVar44._0_4_ = -(uint)(fVar50 < tray.tfar.field_0.v[0]);
                  auVar44._8_4_ = -(uint)(fVar57 < tray.tfar.field_0.v[2]);
                  auVar44._12_4_ = -(uint)(fVar58 < tray.tfar.field_0.v[3]);
                  iVar26 = movmskps(iVar26,auVar44);
                  if (iVar26 == 0) {
                    iVar26 = 2;
                    aVar128 = _DAT_01feb9f0;
                  }
                  else {
                    bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                    uVar14 = (ulong)bVar1;
                    pvVar3 = This->leafIntersector;
                    local_1808 = auVar55._0_8_;
                    uStack_1800 = auVar55._8_8_;
                    valid_o.field_0._0_8_ = local_1808;
                    valid_o.field_0._8_8_ = uStack_1800;
                    uVar13 = movmskps((int)pIVar17,(undefined1  [16])terminated.field_0);
                    uVar13 = uVar13 ^ 0xf;
                    pIVar17 = (Intersectors *)(ulong)uVar13;
                    if (uVar13 != 0) {
                      uVar24 = (ulong)(byte)uVar13;
                      do {
                        lVar4 = 0;
                        if (uVar24 != 0) {
                          for (; (uVar24 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                          }
                        }
                        pIVar20 = (Intersectors *)&pre;
                        cVar12 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                           (pIVar20,ray,lVar4,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        if (cVar12 != '\0') {
                          valid_o.field_0.i[lVar4] = -1;
                        }
                        uVar14 = uVar24 - 1;
                        uVar24 = uVar24 & uVar14;
                        pIVar17 = extraout_RDX;
                      } while (uVar24 != 0);
                    }
                    auVar10._8_8_ = valid_o.field_0._8_8_;
                    auVar10._0_8_ = valid_o.field_0._0_8_;
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])vVar11.field_0 | auVar10);
                    iVar26 = movmskps((int)uVar14,(undefined1  [16])terminated.field_0);
                    aVar128 = _DAT_01feb9f0;
                    if (iVar26 == 0xf) {
                      iVar26 = 3;
                    }
                    else {
                      tray.tfar.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                    (undefined1  [16])terminated.field_0);
                      iVar26 = 0;
                    }
                  }
                  break;
                }
                uVar14 = root.ptr & 0xfffffffffffffff0;
                uVar13 = (uint)root.ptr & 7;
                pIVar18 = (Intersectors *)0x0;
                sVar19 = 8;
                pIVar17 = pIVar20;
                aVar61 = aVar128;
                do {
                  sVar2 = *(size_t *)(uVar14 + (long)pIVar18 * 8);
                  root.ptr = sVar19;
                  pIVar20 = pIVar17;
                  aVar54 = aVar61;
                  if (sVar2 != 8) {
                    if ((uVar13 == 6) || (uVar13 == 1)) {
                      fVar59 = *(float *)(uVar14 + 0x80 + (long)pIVar18 * 4);
                      fVar63 = *(float *)(uVar14 + 0x20 + (long)pIVar18 * 4);
                      fVar65 = *(float *)(uVar14 + 0x30 + (long)pIVar18 * 4);
                      fVar67 = *(float *)(uVar14 + 0x40 + (long)pIVar18 * 4);
                      fVar68 = *(float *)(uVar14 + 0x50 + (long)pIVar18 * 4);
                      fVar47 = *(float *)(ray + 0x70);
                      fVar115 = *(float *)(ray + 0x74);
                      fVar119 = *(float *)(ray + 0x78);
                      fVar121 = *(float *)(ray + 0x7c);
                      fVar71 = *(float *)(uVar14 + 0xa0 + (long)pIVar18 * 4);
                      fVar73 = *(float *)(uVar14 + 0xc0 + (long)pIVar18 * 4);
                      fVar75 = *(float *)(uVar14 + 0x60 + (long)pIVar18 * 4);
                      fVar83 = *(float *)(uVar14 + 0x90 + (long)pIVar18 * 4);
                      fVar27 = *(float *)(uVar14 + 0xb0 + (long)pIVar18 * 4);
                      fVar28 = *(float *)(uVar14 + 0xd0 + (long)pIVar18 * 4);
                      fVar45 = *(float *)(uVar14 + 0x70 + (long)pIVar18 * 4);
                      fVar29 = ((fVar59 * fVar47 + fVar63) - (float)tray.org.field_0._0_4_) *
                               (float)tray.rdir.field_0._0_4_;
                      fVar46 = ((fVar59 * fVar115 + fVar63) - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar48 = ((fVar59 * fVar119 + fVar63) - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar59 = ((fVar59 * fVar121 + fVar63) - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar69 = ((fVar71 * fVar47 + fVar67) - (float)tray.org.field_0._16_4_) *
                               (float)tray.rdir.field_0._16_4_;
                      fVar72 = ((fVar71 * fVar115 + fVar67) - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar74 = ((fVar71 * fVar119 + fVar67) - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar71 = ((fVar71 * fVar121 + fVar67) - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar77 = ((fVar73 * fVar47 + fVar75) - (float)tray.org.field_0._32_4_) *
                               tray.rdir.field_0._32_4_;
                      fVar78 = ((fVar73 * fVar115 + fVar75) - (float)tray.org.field_0._36_4_) *
                               tray.rdir.field_0._36_4_;
                      fVar79 = ((fVar73 * fVar119 + fVar75) - (float)tray.org.field_0._40_4_) *
                               tray.rdir.field_0._40_4_;
                      fVar73 = ((fVar73 * fVar121 + fVar75) - (float)tray.org.field_0._44_4_) *
                               tray.rdir.field_0._44_4_;
                      fVar75 = ((fVar83 * fVar47 + fVar65) - (float)tray.org.field_0._0_4_) *
                               (float)tray.rdir.field_0._0_4_;
                      fVar81 = ((fVar83 * fVar115 + fVar65) - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar82 = ((fVar83 * fVar119 + fVar65) - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar83 = ((fVar83 * fVar121 + fVar65) - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar84 = ((fVar27 * fVar47 + fVar68) - (float)tray.org.field_0._16_4_) *
                               (float)tray.rdir.field_0._16_4_;
                      fVar86 = ((fVar27 * fVar115 + fVar68) - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar87 = ((fVar27 * fVar119 + fVar68) - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar27 = ((fVar27 * fVar121 + fVar68) - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar63 = ((fVar28 * fVar47 + fVar45) - (float)tray.org.field_0._32_4_) *
                               tray.rdir.field_0._32_4_;
                      fVar65 = ((fVar28 * fVar115 + fVar45) - (float)tray.org.field_0._36_4_) *
                               tray.rdir.field_0._36_4_;
                      fVar67 = ((fVar28 * fVar119 + fVar45) - (float)tray.org.field_0._40_4_) *
                               tray.rdir.field_0._40_4_;
                      fVar68 = ((fVar28 * fVar121 + fVar45) - (float)tray.org.field_0._44_4_) *
                               tray.rdir.field_0._44_4_;
                      uVar88 = (uint)((int)fVar75 < (int)fVar29) * (int)fVar75 |
                               (uint)((int)fVar75 >= (int)fVar29) * (int)fVar29;
                      uVar89 = (uint)((int)fVar81 < (int)fVar46) * (int)fVar81 |
                               (uint)((int)fVar81 >= (int)fVar46) * (int)fVar46;
                      uVar90 = (uint)((int)fVar82 < (int)fVar48) * (int)fVar82 |
                               (uint)((int)fVar82 >= (int)fVar48) * (int)fVar48;
                      uVar91 = (uint)((int)fVar83 < (int)fVar59) * (int)fVar83 |
                               (uint)((int)fVar83 >= (int)fVar59) * (int)fVar59;
                      uVar98 = (uint)((int)fVar84 < (int)fVar69) * (int)fVar84 |
                               (uint)((int)fVar84 >= (int)fVar69) * (int)fVar69;
                      uVar102 = (uint)((int)fVar86 < (int)fVar72) * (int)fVar86 |
                                (uint)((int)fVar86 >= (int)fVar72) * (int)fVar72;
                      uVar104 = (uint)((int)fVar87 < (int)fVar74) * (int)fVar87 |
                                (uint)((int)fVar87 >= (int)fVar74) * (int)fVar74;
                      uVar106 = (uint)((int)fVar27 < (int)fVar71) * (int)fVar27 |
                                (uint)((int)fVar27 >= (int)fVar71) * (int)fVar71;
                      uVar98 = ((int)uVar98 < (int)uVar88) * uVar88 |
                               ((int)uVar98 >= (int)uVar88) * uVar98;
                      uVar102 = ((int)uVar102 < (int)uVar89) * uVar89 |
                                ((int)uVar102 >= (int)uVar89) * uVar102;
                      uVar104 = ((int)uVar104 < (int)uVar90) * uVar90 |
                                ((int)uVar104 >= (int)uVar90) * uVar104;
                      uVar106 = ((int)uVar106 < (int)uVar91) * uVar91 |
                                ((int)uVar106 >= (int)uVar91) * uVar106;
                      uVar88 = (uint)((int)fVar63 < (int)fVar77) * (int)fVar63 |
                               (uint)((int)fVar63 >= (int)fVar77) * (int)fVar77;
                      uVar89 = (uint)((int)fVar65 < (int)fVar78) * (int)fVar65 |
                               (uint)((int)fVar65 >= (int)fVar78) * (int)fVar78;
                      uVar90 = (uint)((int)fVar67 < (int)fVar79) * (int)fVar67 |
                               (uint)((int)fVar67 >= (int)fVar79) * (int)fVar79;
                      uVar91 = (uint)((int)fVar68 < (int)fVar73) * (int)fVar68 |
                               (uint)((int)fVar68 >= (int)fVar73) * (int)fVar73;
                      fVar28 = (float)(((int)uVar88 < (int)uVar98) * uVar98 |
                                      ((int)uVar88 >= (int)uVar98) * uVar88) * 0.99999964;
                      fVar45 = (float)(((int)uVar89 < (int)uVar102) * uVar102 |
                                      ((int)uVar89 >= (int)uVar102) * uVar89) * 0.99999964;
                      fVar94 = (float)(((int)uVar90 < (int)uVar104) * uVar104 |
                                      ((int)uVar90 >= (int)uVar104) * uVar90) * 0.99999964;
                      fVar96 = (float)(((int)uVar91 < (int)uVar106) * uVar106 |
                                      ((int)uVar91 >= (int)uVar106) * uVar91) * 0.99999964;
                      uVar88 = (uint)((int)fVar75 < (int)fVar29) * (int)fVar29 |
                               (uint)((int)fVar75 >= (int)fVar29) * (int)fVar75;
                      uVar89 = (uint)((int)fVar81 < (int)fVar46) * (int)fVar46 |
                               (uint)((int)fVar81 >= (int)fVar46) * (int)fVar81;
                      uVar90 = (uint)((int)fVar82 < (int)fVar48) * (int)fVar48 |
                               (uint)((int)fVar82 >= (int)fVar48) * (int)fVar82;
                      uVar91 = (uint)((int)fVar83 < (int)fVar59) * (int)fVar59 |
                               (uint)((int)fVar83 >= (int)fVar59) * (int)fVar83;
                      uVar98 = (uint)((int)fVar84 < (int)fVar69) * (int)fVar69 |
                               (uint)((int)fVar84 >= (int)fVar69) * (int)fVar84;
                      uVar102 = (uint)((int)fVar86 < (int)fVar72) * (int)fVar72 |
                                (uint)((int)fVar86 >= (int)fVar72) * (int)fVar86;
                      uVar104 = (uint)((int)fVar87 < (int)fVar74) * (int)fVar74 |
                                (uint)((int)fVar87 >= (int)fVar74) * (int)fVar87;
                      uVar106 = (uint)((int)fVar27 < (int)fVar71) * (int)fVar71 |
                                (uint)((int)fVar27 >= (int)fVar71) * (int)fVar27;
                      uVar98 = ((int)uVar88 < (int)uVar98) * uVar88 |
                               ((int)uVar88 >= (int)uVar98) * uVar98;
                      uVar102 = ((int)uVar89 < (int)uVar102) * uVar89 |
                                ((int)uVar89 >= (int)uVar102) * uVar102;
                      uVar104 = ((int)uVar90 < (int)uVar104) * uVar90 |
                                ((int)uVar90 >= (int)uVar104) * uVar104;
                      uVar106 = ((int)uVar91 < (int)uVar106) * uVar91 |
                                ((int)uVar91 >= (int)uVar106) * uVar106;
                      uVar88 = (uint)((int)fVar63 < (int)fVar77) * (int)fVar77 |
                               (uint)((int)fVar63 >= (int)fVar77) * (int)fVar63;
                      uVar89 = (uint)((int)fVar65 < (int)fVar78) * (int)fVar78 |
                               (uint)((int)fVar65 >= (int)fVar78) * (int)fVar65;
                      uVar90 = (uint)((int)fVar67 < (int)fVar79) * (int)fVar79 |
                               (uint)((int)fVar67 >= (int)fVar79) * (int)fVar67;
                      uVar91 = (uint)((int)fVar68 < (int)fVar73) * (int)fVar73 |
                               (uint)((int)fVar68 >= (int)fVar73) * (int)fVar68;
                      fVar59 = (float)(((int)uVar98 < (int)uVar88) * uVar98 |
                                      ((int)uVar98 >= (int)uVar88) * uVar88) * 1.0000004;
                      fVar63 = (float)(((int)uVar102 < (int)uVar89) * uVar102 |
                                      ((int)uVar102 >= (int)uVar89) * uVar89) * 1.0000004;
                      fVar65 = (float)(((int)uVar104 < (int)uVar90) * uVar104 |
                                      ((int)uVar104 >= (int)uVar90) * uVar90) * 1.0000004;
                      fVar67 = (float)(((int)uVar106 < (int)uVar91) * uVar106 |
                                      ((int)uVar106 >= (int)uVar91) * uVar91) * 1.0000004;
                      bVar25 = (float)((uint)(tray.tnear.field_0.i[0] < (int)fVar28) * (int)fVar28 |
                                      (uint)(tray.tnear.field_0.i[0] >= (int)fVar28) *
                                      tray.tnear.field_0.i[0]) <=
                               (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar59) *
                                       tray.tfar.field_0.i[0] |
                                      (uint)(tray.tfar.field_0.i[0] >= (int)fVar59) * (int)fVar59);
                      uVar88 = -(uint)bVar25;
                      bVar5 = (float)((uint)(tray.tnear.field_0.i[1] < (int)fVar45) * (int)fVar45 |
                                     (uint)(tray.tnear.field_0.i[1] >= (int)fVar45) *
                                     tray.tnear.field_0.i[1]) <=
                              (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar63) *
                                      tray.tfar.field_0.i[1] |
                                     (uint)(tray.tfar.field_0.i[1] >= (int)fVar63) * (int)fVar63);
                      uVar89 = -(uint)bVar5;
                      bVar6 = (float)((uint)(tray.tnear.field_0.i[2] < (int)fVar94) * (int)fVar94 |
                                     (uint)(tray.tnear.field_0.i[2] >= (int)fVar94) *
                                     tray.tnear.field_0.i[2]) <=
                              (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar65) *
                                      tray.tfar.field_0.i[2] |
                                     (uint)(tray.tfar.field_0.i[2] >= (int)fVar65) * (int)fVar65);
                      uVar90 = -(uint)bVar6;
                      bVar7 = (float)((uint)(tray.tnear.field_0.i[3] < (int)fVar96) * (int)fVar96 |
                                     (uint)(tray.tnear.field_0.i[3] >= (int)fVar96) *
                                     tray.tnear.field_0.i[3]) <=
                              (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar67) *
                                      tray.tfar.field_0.i[3] |
                                     (uint)(tray.tfar.field_0.i[3] >= (int)fVar67) * (int)fVar67);
                      uVar91 = -(uint)bVar7;
                      if (uVar13 == 6) {
                        fVar59 = *(float *)(uVar14 + 0xe0 + (long)pIVar18 * 4);
                        fVar63 = *(float *)(uVar14 + 0xf0 + (long)pIVar18 * 4);
                        uVar88 = -(uint)((fVar47 < fVar63 && fVar59 <= fVar47) && bVar25);
                        uVar89 = -(uint)((fVar115 < fVar63 && fVar59 <= fVar115) && bVar5);
                        uVar90 = -(uint)((fVar119 < fVar63 && fVar59 <= fVar119) && bVar6);
                        uVar91 = -(uint)((fVar121 < fVar63 && fVar59 <= fVar121) && bVar7);
                      }
                    }
                    else {
                      fVar59 = *(float *)(uVar14 + 0x20 + (long)pIVar18 * 4);
                      fVar63 = *(float *)(uVar14 + 0x50 + (long)pIVar18 * 4);
                      fVar65 = *(float *)(uVar14 + 0x60 + (long)pIVar18 * 4);
                      fVar67 = *(float *)(uVar14 + 0x80 + (long)pIVar18 * 4);
                      fVar68 = *(float *)(uVar14 + 0x90 + (long)pIVar18 * 4);
                      fVar71 = *(float *)(uVar14 + 0xe0 + (long)pIVar18 * 4);
                      fVar73 = *(float *)(uVar14 + 0xf0 + (long)pIVar18 * 4);
                      fVar75 = *(float *)(uVar14 + 0x100 + (long)pIVar18 * 4);
                      fVar83 = *(float *)(uVar14 + 0x110 + (long)pIVar18 * 4);
                      fVar27 = *(float *)(uVar14 + 0x120 + (long)pIVar18 * 4);
                      fVar28 = *(float *)(uVar14 + 0x130 + (long)pIVar18 * 4);
                      fVar48 = *(float *)(ray + 0x70);
                      fVar69 = *(float *)(ray + 0x74);
                      fVar72 = *(float *)(ray + 0x78);
                      fVar74 = *(float *)(ray + 0x7c);
                      fVar107 = 1.0 - fVar48;
                      fVar109 = 1.0 - fVar69;
                      fVar111 = 1.0 - fVar72;
                      fVar113 = 1.0 - fVar74;
                      fVar108 = fVar107 * 0.0;
                      fVar110 = fVar109 * 0.0;
                      fVar112 = fVar111 * 0.0;
                      fVar114 = fVar113 * 0.0;
                      auVar52._0_4_ =
                           fVar59 * (float)tray.dir.field_0._0_4_ +
                           fVar63 * (float)tray.dir.field_0._16_4_ +
                           fVar67 * (float)tray.dir.field_0._32_4_;
                      auVar52._4_4_ =
                           fVar59 * (float)tray.dir.field_0._4_4_ +
                           fVar63 * (float)tray.dir.field_0._20_4_ +
                           fVar67 * (float)tray.dir.field_0._36_4_;
                      auVar52._8_4_ =
                           fVar59 * (float)tray.dir.field_0._8_4_ +
                           fVar63 * (float)tray.dir.field_0._24_4_ +
                           fVar67 * (float)tray.dir.field_0._40_4_;
                      auVar52._12_4_ =
                           fVar59 * (float)tray.dir.field_0._12_4_ +
                           fVar63 * (float)tray.dir.field_0._28_4_ +
                           fVar67 * (float)tray.dir.field_0._44_4_;
                      fVar45 = *(float *)(uVar14 + 0x30 + (long)pIVar18 * 4);
                      auVar127._0_4_ =
                           fVar45 * (float)tray.dir.field_0._0_4_ +
                           fVar65 * (float)tray.dir.field_0._16_4_ +
                           fVar68 * (float)tray.dir.field_0._32_4_;
                      auVar127._4_4_ =
                           fVar45 * (float)tray.dir.field_0._4_4_ +
                           fVar65 * (float)tray.dir.field_0._20_4_ +
                           fVar68 * (float)tray.dir.field_0._36_4_;
                      auVar127._8_4_ =
                           fVar45 * (float)tray.dir.field_0._8_4_ +
                           fVar65 * (float)tray.dir.field_0._24_4_ +
                           fVar68 * (float)tray.dir.field_0._40_4_;
                      auVar127._12_4_ =
                           fVar45 * (float)tray.dir.field_0._12_4_ +
                           fVar65 * (float)tray.dir.field_0._28_4_ +
                           fVar68 * (float)tray.dir.field_0._44_4_;
                      fVar121 = (float)DAT_01ff1d40;
                      fVar29 = DAT_01ff1d40._4_4_;
                      fVar46 = DAT_01ff1d40._8_4_;
                      fVar77 = DAT_01ff1d40._12_4_;
                      auVar39._4_4_ = -(uint)(ABS(auVar52._4_4_) < fVar29);
                      auVar39._0_4_ = -(uint)(ABS(auVar52._0_4_) < fVar121);
                      auVar39._8_4_ = -(uint)(ABS(auVar52._8_4_) < fVar46);
                      auVar39._12_4_ = -(uint)(ABS(auVar52._12_4_) < fVar77);
                      auVar70 = blendvps(auVar52,_DAT_01ff1d40,auVar39);
                      auVar40._4_4_ = -(uint)(ABS(auVar127._4_4_) < fVar29);
                      auVar40._0_4_ = -(uint)(ABS(auVar127._0_4_) < fVar121);
                      auVar40._8_4_ = -(uint)(ABS(auVar127._8_4_) < fVar46);
                      auVar40._12_4_ = -(uint)(ABS(auVar127._12_4_) < fVar77);
                      auVar85 = blendvps(auVar127,_DAT_01ff1d40,auVar40);
                      fVar47 = *(float *)(uVar14 + 0x70 + (long)pIVar18 * 4);
                      fVar115 = *(float *)(uVar14 + 0xa0 + (long)pIVar18 * 4);
                      fVar119 = *(float *)(uVar14 + 0x40 + (long)pIVar18 * 4);
                      auVar62._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar119 +
                           (float)tray.dir.field_0._16_4_ * fVar47 +
                           (float)tray.dir.field_0._32_4_ * fVar115;
                      auVar62._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar119 +
                           (float)tray.dir.field_0._20_4_ * fVar47 +
                           (float)tray.dir.field_0._36_4_ * fVar115;
                      auVar62._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar119 +
                           (float)tray.dir.field_0._24_4_ * fVar47 +
                           (float)tray.dir.field_0._40_4_ * fVar115;
                      auVar62._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar119 +
                           (float)tray.dir.field_0._28_4_ * fVar47 +
                           (float)tray.dir.field_0._44_4_ * fVar115;
                      auVar41._4_4_ = -(uint)(ABS(auVar62._4_4_) < fVar29);
                      auVar41._0_4_ = -(uint)(ABS(auVar62._0_4_) < fVar121);
                      auVar41._8_4_ = -(uint)(ABS(auVar62._8_4_) < fVar46);
                      auVar41._12_4_ = -(uint)(ABS(auVar62._12_4_) < fVar77);
                      auVar100 = blendvps(auVar62,_DAT_01ff1d40,auVar41);
                      auVar80 = rcpps(auVar41,auVar70);
                      fVar77 = auVar80._0_4_;
                      auVar53._0_4_ = auVar70._0_4_ * fVar77;
                      fVar81 = auVar80._4_4_;
                      auVar53._4_4_ = auVar70._4_4_ * fVar81;
                      fVar86 = auVar80._8_4_;
                      auVar53._8_4_ = auVar70._8_4_ * fVar86;
                      fVar96 = auVar80._12_4_;
                      auVar53._12_4_ = auVar70._12_4_ * fVar96;
                      fVar77 = (1.0 - auVar53._0_4_) * fVar77 + fVar77;
                      fVar81 = (1.0 - auVar53._4_4_) * fVar81 + fVar81;
                      fVar86 = (1.0 - auVar53._8_4_) * fVar86 + fVar86;
                      fVar96 = (1.0 - auVar53._12_4_) * fVar96 + fVar96;
                      auVar80 = rcpps(auVar80,auVar85);
                      fVar78 = auVar80._0_4_;
                      fVar82 = auVar80._4_4_;
                      fVar87 = auVar80._8_4_;
                      fVar76 = auVar80._12_4_;
                      fVar78 = (1.0 - auVar85._0_4_ * fVar78) * fVar78 + fVar78;
                      fVar82 = (1.0 - auVar85._4_4_ * fVar82) * fVar82 + fVar82;
                      fVar87 = (1.0 - auVar85._8_4_ * fVar87) * fVar87 + fVar87;
                      fVar76 = (1.0 - auVar85._12_4_ * fVar76) * fVar76 + fVar76;
                      auVar80 = rcpps(auVar53,auVar100);
                      fVar79 = auVar80._0_4_;
                      fVar84 = auVar80._4_4_;
                      fVar94 = auVar80._8_4_;
                      fVar49 = auVar80._12_4_;
                      fVar79 = (1.0 - auVar100._0_4_ * fVar79) * fVar79 + fVar79;
                      fVar84 = (1.0 - auVar100._4_4_ * fVar84) * fVar84 + fVar84;
                      fVar94 = (1.0 - auVar100._8_4_ * fVar94) * fVar94 + fVar94;
                      fVar49 = (1.0 - auVar100._12_4_ * fVar49) * fVar49 + fVar49;
                      fVar121 = *(float *)(uVar14 + 0xb0 + (long)pIVar18 * 4);
                      fVar29 = *(float *)(uVar14 + 0xc0 + (long)pIVar18 * 4);
                      fVar46 = *(float *)(uVar14 + 0xd0 + (long)pIVar18 * 4);
                      fVar60 = fVar59 * (float)tray.org.field_0._0_4_ +
                               fVar63 * (float)tray.org.field_0._16_4_ +
                               fVar67 * (float)tray.org.field_0._32_4_ + fVar121;
                      fVar64 = fVar59 * (float)tray.org.field_0._4_4_ +
                               fVar63 * (float)tray.org.field_0._20_4_ +
                               fVar67 * (float)tray.org.field_0._36_4_ + fVar121;
                      fVar66 = fVar59 * (float)tray.org.field_0._8_4_ +
                               fVar63 * (float)tray.org.field_0._24_4_ +
                               fVar67 * (float)tray.org.field_0._40_4_ + fVar121;
                      fVar121 = fVar59 * (float)tray.org.field_0._12_4_ +
                                fVar63 * (float)tray.org.field_0._28_4_ +
                                fVar67 * (float)tray.org.field_0._44_4_ + fVar121;
                      fVar99 = fVar45 * (float)tray.org.field_0._0_4_ +
                               fVar65 * (float)tray.org.field_0._16_4_ +
                               fVar68 * (float)tray.org.field_0._32_4_ + fVar29;
                      fVar103 = fVar45 * (float)tray.org.field_0._4_4_ +
                                fVar65 * (float)tray.org.field_0._20_4_ +
                                fVar68 * (float)tray.org.field_0._36_4_ + fVar29;
                      fVar105 = fVar45 * (float)tray.org.field_0._8_4_ +
                                fVar65 * (float)tray.org.field_0._24_4_ +
                                fVar68 * (float)tray.org.field_0._40_4_ + fVar29;
                      fVar68 = fVar45 * (float)tray.org.field_0._12_4_ +
                               fVar65 * (float)tray.org.field_0._28_4_ +
                               fVar68 * (float)tray.org.field_0._44_4_ + fVar29;
                      fVar29 = fVar119 * (float)tray.org.field_0._0_4_ +
                               fVar47 * (float)tray.org.field_0._16_4_ +
                               fVar115 * (float)tray.org.field_0._32_4_ + fVar46;
                      fVar129 = fVar119 * (float)tray.org.field_0._4_4_ +
                                fVar47 * (float)tray.org.field_0._20_4_ +
                                fVar115 * (float)tray.org.field_0._36_4_ + fVar46;
                      fVar130 = fVar119 * (float)tray.org.field_0._8_4_ +
                                fVar47 * (float)tray.org.field_0._24_4_ +
                                fVar115 * (float)tray.org.field_0._40_4_ + fVar46;
                      fVar119 = fVar119 * (float)tray.org.field_0._12_4_ +
                                fVar47 * (float)tray.org.field_0._28_4_ +
                                fVar115 * (float)tray.org.field_0._44_4_ + fVar46;
                      fVar59 = ((fVar71 * fVar48 + fVar108) - fVar60) * fVar77;
                      fVar63 = ((fVar71 * fVar69 + fVar110) - fVar64) * fVar81;
                      fVar65 = ((fVar71 * fVar72 + fVar112) - fVar66) * fVar86;
                      fVar67 = ((fVar71 * fVar74 + fVar114) - fVar121) * fVar96;
                      fVar77 = ((fVar83 * fVar48 + fVar107) - fVar60) * fVar77;
                      fVar81 = ((fVar83 * fVar69 + fVar109) - fVar64) * fVar81;
                      fVar86 = ((fVar83 * fVar72 + fVar111) - fVar66) * fVar86;
                      fVar96 = ((fVar83 * fVar74 + fVar113) - fVar121) * fVar96;
                      fVar83 = ((fVar73 * fVar48 + fVar108) - fVar99) * fVar78;
                      fVar45 = ((fVar73 * fVar69 + fVar110) - fVar103) * fVar82;
                      fVar47 = ((fVar73 * fVar72 + fVar112) - fVar105) * fVar87;
                      fVar115 = ((fVar73 * fVar74 + fVar114) - fVar68) * fVar76;
                      fVar78 = ((fVar27 * fVar48 + fVar107) - fVar99) * fVar78;
                      fVar82 = ((fVar27 * fVar69 + fVar109) - fVar103) * fVar82;
                      fVar87 = ((fVar27 * fVar72 + fVar111) - fVar105) * fVar87;
                      fVar76 = ((fVar27 * fVar74 + fVar113) - fVar68) * fVar76;
                      fVar68 = ((fVar108 + fVar75 * fVar48) - fVar29) * fVar79;
                      fVar71 = ((fVar110 + fVar75 * fVar69) - fVar129) * fVar84;
                      fVar73 = ((fVar112 + fVar75 * fVar72) - fVar130) * fVar94;
                      fVar75 = ((fVar114 + fVar75 * fVar74) - fVar119) * fVar49;
                      fVar79 = ((fVar28 * fVar48 + fVar107) - fVar29) * fVar79;
                      fVar84 = ((fVar28 * fVar69 + fVar109) - fVar129) * fVar84;
                      fVar94 = ((fVar28 * fVar72 + fVar111) - fVar130) * fVar94;
                      fVar49 = ((fVar28 * fVar74 + fVar113) - fVar119) * fVar49;
                      uVar88 = (uint)((int)fVar77 < (int)fVar59) * (int)fVar77 |
                               (uint)((int)fVar77 >= (int)fVar59) * (int)fVar59;
                      uVar89 = (uint)((int)fVar81 < (int)fVar63) * (int)fVar81 |
                               (uint)((int)fVar81 >= (int)fVar63) * (int)fVar63;
                      uVar90 = (uint)((int)fVar86 < (int)fVar65) * (int)fVar86 |
                               (uint)((int)fVar86 >= (int)fVar65) * (int)fVar65;
                      uVar91 = (uint)((int)fVar96 < (int)fVar67) * (int)fVar96 |
                               (uint)((int)fVar96 >= (int)fVar67) * (int)fVar67;
                      uVar98 = (uint)((int)fVar78 < (int)fVar83) * (int)fVar78 |
                               (uint)((int)fVar78 >= (int)fVar83) * (int)fVar83;
                      uVar102 = (uint)((int)fVar82 < (int)fVar45) * (int)fVar82 |
                                (uint)((int)fVar82 >= (int)fVar45) * (int)fVar45;
                      uVar104 = (uint)((int)fVar87 < (int)fVar47) * (int)fVar87 |
                                (uint)((int)fVar87 >= (int)fVar47) * (int)fVar47;
                      uVar106 = (uint)((int)fVar76 < (int)fVar115) * (int)fVar76 |
                                (uint)((int)fVar76 >= (int)fVar115) * (int)fVar115;
                      uVar88 = ((int)uVar98 < (int)uVar88) * uVar88 |
                               ((int)uVar98 >= (int)uVar88) * uVar98;
                      uVar89 = ((int)uVar102 < (int)uVar89) * uVar89 |
                               ((int)uVar102 >= (int)uVar89) * uVar102;
                      uVar90 = ((int)uVar104 < (int)uVar90) * uVar90 |
                               ((int)uVar104 >= (int)uVar90) * uVar104;
                      uVar91 = ((int)uVar106 < (int)uVar91) * uVar91 |
                               ((int)uVar106 >= (int)uVar91) * uVar106;
                      uVar92 = (uint)((int)fVar79 < (int)fVar68) * (int)fVar79 |
                               (uint)((int)fVar79 >= (int)fVar68) * (int)fVar68;
                      uVar93 = (uint)((int)fVar84 < (int)fVar71) * (int)fVar84 |
                               (uint)((int)fVar84 >= (int)fVar71) * (int)fVar71;
                      uVar95 = (uint)((int)fVar94 < (int)fVar73) * (int)fVar94 |
                               (uint)((int)fVar94 >= (int)fVar73) * (int)fVar73;
                      uVar97 = (uint)((int)fVar49 < (int)fVar75) * (int)fVar49 |
                               (uint)((int)fVar49 >= (int)fVar75) * (int)fVar75;
                      uVar116 = (uint)((int)fVar77 < (int)fVar59) * (int)fVar59 |
                                (uint)((int)fVar77 >= (int)fVar59) * (int)fVar77;
                      uVar120 = (uint)((int)fVar81 < (int)fVar63) * (int)fVar63 |
                                (uint)((int)fVar81 >= (int)fVar63) * (int)fVar81;
                      uVar122 = (uint)((int)fVar86 < (int)fVar65) * (int)fVar65 |
                                (uint)((int)fVar86 >= (int)fVar65) * (int)fVar86;
                      uVar123 = (uint)((int)fVar96 < (int)fVar67) * (int)fVar67 |
                                (uint)((int)fVar96 >= (int)fVar67) * (int)fVar96;
                      uVar98 = (uint)((int)fVar78 < (int)fVar83) * (int)fVar83 |
                               (uint)((int)fVar78 >= (int)fVar83) * (int)fVar78;
                      uVar102 = (uint)((int)fVar82 < (int)fVar45) * (int)fVar45 |
                                (uint)((int)fVar82 >= (int)fVar45) * (int)fVar82;
                      uVar104 = (uint)((int)fVar87 < (int)fVar47) * (int)fVar47 |
                                (uint)((int)fVar87 >= (int)fVar47) * (int)fVar87;
                      uVar106 = (uint)((int)fVar76 < (int)fVar115) * (int)fVar115 |
                                (uint)((int)fVar76 >= (int)fVar115) * (int)fVar76;
                      uVar116 = ((int)uVar116 < (int)uVar98) * uVar116 |
                                ((int)uVar116 >= (int)uVar98) * uVar98;
                      uVar120 = ((int)uVar120 < (int)uVar102) * uVar120 |
                                ((int)uVar120 >= (int)uVar102) * uVar102;
                      uVar122 = ((int)uVar122 < (int)uVar104) * uVar122 |
                                ((int)uVar122 >= (int)uVar104) * uVar104;
                      uVar123 = ((int)uVar123 < (int)uVar106) * uVar123 |
                                ((int)uVar123 >= (int)uVar106) * uVar106;
                      uVar98 = (uint)((int)fVar79 < (int)fVar68) * (int)fVar68 |
                               (uint)((int)fVar79 >= (int)fVar68) * (int)fVar79;
                      uVar102 = (uint)((int)fVar84 < (int)fVar71) * (int)fVar71 |
                                (uint)((int)fVar84 >= (int)fVar71) * (int)fVar84;
                      uVar104 = (uint)((int)fVar94 < (int)fVar73) * (int)fVar73 |
                                (uint)((int)fVar94 >= (int)fVar73) * (int)fVar94;
                      uVar106 = (uint)((int)fVar49 < (int)fVar75) * (int)fVar75 |
                                (uint)((int)fVar49 >= (int)fVar75) * (int)fVar49;
                      fVar28 = (float)(((int)uVar92 < (int)uVar88) * uVar88 |
                                      ((int)uVar92 >= (int)uVar88) * uVar92) * 0.99999964;
                      fVar45 = (float)(((int)uVar93 < (int)uVar89) * uVar89 |
                                      ((int)uVar93 >= (int)uVar89) * uVar93) * 0.99999964;
                      fVar94 = (float)(((int)uVar95 < (int)uVar90) * uVar90 |
                                      ((int)uVar95 >= (int)uVar90) * uVar95) * 0.99999964;
                      fVar96 = (float)(((int)uVar97 < (int)uVar91) * uVar91 |
                                      ((int)uVar97 >= (int)uVar91) * uVar97) * 0.99999964;
                      fVar59 = (float)(((int)uVar116 < (int)uVar98) * uVar116 |
                                      ((int)uVar116 >= (int)uVar98) * uVar98) * 1.0000004;
                      fVar63 = (float)(((int)uVar120 < (int)uVar102) * uVar120 |
                                      ((int)uVar120 >= (int)uVar102) * uVar102) * 1.0000004;
                      fVar65 = (float)(((int)uVar122 < (int)uVar104) * uVar122 |
                                      ((int)uVar122 >= (int)uVar104) * uVar104) * 1.0000004;
                      fVar67 = (float)(((int)uVar123 < (int)uVar106) * uVar123 |
                                      ((int)uVar123 >= (int)uVar106) * uVar106) * 1.0000004;
                      uVar88 = -(uint)((float)((uint)(tray.tnear.field_0.i[0] < (int)fVar28) *
                                               (int)fVar28 |
                                              (uint)(tray.tnear.field_0.i[0] >= (int)fVar28) *
                                              tray.tnear.field_0.i[0]) <=
                                      (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar59) *
                                              tray.tfar.field_0.i[0] |
                                             (uint)(tray.tfar.field_0.i[0] >= (int)fVar59) *
                                             (int)fVar59));
                      uVar89 = -(uint)((float)((uint)(tray.tnear.field_0.i[1] < (int)fVar45) *
                                               (int)fVar45 |
                                              (uint)(tray.tnear.field_0.i[1] >= (int)fVar45) *
                                              tray.tnear.field_0.i[1]) <=
                                      (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar63) *
                                              tray.tfar.field_0.i[1] |
                                             (uint)(tray.tfar.field_0.i[1] >= (int)fVar63) *
                                             (int)fVar63));
                      uVar90 = -(uint)((float)((uint)(tray.tnear.field_0.i[2] < (int)fVar94) *
                                               (int)fVar94 |
                                              (uint)(tray.tnear.field_0.i[2] >= (int)fVar94) *
                                              tray.tnear.field_0.i[2]) <=
                                      (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar65) *
                                              tray.tfar.field_0.i[2] |
                                             (uint)(tray.tfar.field_0.i[2] >= (int)fVar65) *
                                             (int)fVar65));
                      uVar91 = -(uint)((float)((uint)(tray.tnear.field_0.i[3] < (int)fVar96) *
                                               (int)fVar96 |
                                              (uint)(tray.tnear.field_0.i[3] >= (int)fVar96) *
                                              tray.tnear.field_0.i[3]) <=
                                      (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar67) *
                                              tray.tfar.field_0.i[3] |
                                             (uint)(tray.tfar.field_0.i[3] >= (int)fVar67) *
                                             (int)fVar67));
                      aVar128 = _DAT_01feb9f0;
                    }
                    auVar42._0_4_ = (uVar88 & -(uint)(fVar50 < tray.tfar.field_0.v[0])) << 0x1f;
                    auVar42._4_4_ = (uVar89 & -(uint)(fVar56 < tray.tfar.field_0.v[1])) << 0x1f;
                    auVar42._8_4_ = (uVar90 & -(uint)(fVar57 < tray.tfar.field_0.v[2])) << 0x1f;
                    auVar42._12_4_ = (uVar91 & -(uint)(fVar58 < tray.tfar.field_0.v[3])) << 0x1f;
                    uVar88 = movmskps((int)pIVar17,auVar42);
                    pIVar20 = (Intersectors *)(ulong)uVar88;
                    if ((uVar88 != 0) &&
                       (auVar8._4_4_ = fVar45, auVar8._0_4_ = fVar28, auVar8._8_4_ = fVar94,
                       auVar8._12_4_ = fVar96, aVar54.v = (__m128)blendvps(aVar128.v,auVar8,auVar42)
                       , root.ptr = sVar2, sVar19 != 8)) {
                      pNVar22->ptr = sVar19;
                      pNVar22 = pNVar22 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar61;
                      paVar23 = paVar23 + 1;
                    }
                  }
                  pIVar17 = pIVar18;
                } while ((sVar2 != 8) &&
                        (pIVar17 = (Intersectors *)
                                   ((long)(((vfloat<4> *)&pIVar18->ptr)->field_0).v + 1),
                        bVar25 = pIVar18 < (Intersectors *)0x3, pIVar18 = pIVar17, sVar19 = root.ptr
                        , pIVar20 = pIVar17, aVar61 = aVar54, bVar25));
                iVar26 = 0;
                if (root.ptr == 8) {
LAB_0025269d:
                  bVar25 = false;
                  iVar26 = 4;
                }
                else {
                  auVar43._4_4_ = -(uint)(aVar54.v[1] < tray.tfar.field_0.v[1]);
                  auVar43._0_4_ = -(uint)(aVar54.v[0] < tray.tfar.field_0.v[0]);
                  auVar43._8_4_ = -(uint)(aVar54.v[2] < tray.tfar.field_0.v[2]);
                  auVar43._12_4_ = -(uint)(aVar54.v[3] < tray.tfar.field_0.v[3]);
                  uVar15 = movmskps(uVar13,auVar43);
                  pIVar17 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar15);
                  bVar25 = true;
                  if (pIVar17 <= pIVar21) {
                    pNVar22->ptr = root.ptr;
                    pNVar22 = pNVar22 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar54;
                    paVar23 = paVar23 + 1;
                    goto LAB_0025269d;
                  }
                }
              } while (bVar25);
            }
          }
        }
      } while (iVar26 != 3);
      auVar55._0_4_ = auVar51._0_4_ & terminated.field_0.i[0];
      auVar55._4_4_ = auVar51._4_4_ & terminated.field_0.i[1];
      auVar55._8_4_ = auVar51._8_4_ & terminated.field_0.i[2];
      auVar55._12_4_ = auVar51._12_4_ & terminated.field_0.i[3];
      auVar55 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar55);
      *(undefined1 (*) [16])(ray + 0x80) = auVar55;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }